

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

uint32_t __thiscall jbcoin::STObject::getFlags(STObject *this)

{
  STBase *pSVar1;
  long lVar2;
  uint32_t uVar3;
  
  pSVar1 = peekAtPField(this,(SField *)sfFlags);
  if (pSVar1 == (STBase *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    lVar2 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar2 != 0) {
      uVar3 = *(uint32_t *)(lVar2 + 0x10);
    }
  }
  return uVar3;
}

Assistant:

std::uint32_t STObject::getFlags (void) const
{
    const STUInt32* t = dynamic_cast<const STUInt32*> (peekAtPField (sfFlags));

    if (!t)
        return 0;

    return t->value ();
}